

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O1

void __thiscall
Js::JavascriptRegExpConstructor::SetLastMatch
          (JavascriptRegExpConstructor *this,RegexPattern *lastPattern,JavascriptString *lastInput,
          GroupInfo lastMatch)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  
  if (0xfffffffeffffffff < (ulong)lastMatch) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x30,"(!lastMatch.IsUndefined())",
                                "SetLastMatch should only be called if there\'s a successful match")
    ;
    if (!bVar3) goto LAB_00d1259b;
    *puVar5 = 0;
  }
  if (lastPattern == (RegexPattern *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x31,"(lastPattern != nullptr)","lastPattern should not be null");
    if (!bVar3) goto LAB_00d1259b;
    *puVar5 = 0;
  }
  if (lastInput == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x32,"(lastInput != nullptr)","lastInput should not be null");
    if (!bVar3) goto LAB_00d1259b;
    *puVar5 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00d1259b;
    *puVar5 = 0;
  }
  TVar1 = ((lastInput->super_RecyclableObject).type.ptr)->typeId;
  if ((0x57 < (int)TVar1) &&
     (BVar4 = RecyclableObject::IsExternal(&lastInput->super_RecyclableObject), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) goto LAB_00d1259b;
    *puVar5 = 0;
  }
  if (TVar1 == TypeIds_Null) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x33,"(JavascriptOperators::GetTypeId(lastInput) != TypeIds_Null)",
                                "lastInput should not be JavaScript null");
    if (!bVar3) {
LAB_00d1259b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  Memory::Recycler::WBSetBit((char *)&this->lastPattern);
  (this->lastPattern).ptr = lastPattern;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastPattern);
  Memory::Recycler::WBSetBit((char *)&this->lastInput);
  (this->lastInput).ptr = lastInput;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastInput);
  (this->lastMatch).offset = lastMatch.offset;
  (this->lastMatch).length = lastMatch.length;
  this->invalidatedLastMatch = false;
  this->reset = true;
  return;
}

Assistant:

void JavascriptRegExpConstructor::SetLastMatch(UnifiedRegex::RegexPattern* lastPattern, JavascriptString* lastInput, UnifiedRegex::GroupInfo lastMatch)
    {
        AssertMsg(!lastMatch.IsUndefined(), "SetLastMatch should only be called if there's a successful match");
        AssertMsg(lastPattern != nullptr, "lastPattern should not be null");
        AssertMsg(lastInput != nullptr, "lastInput should not be null");
        AssertMsg(JavascriptOperators::GetTypeId(lastInput) != TypeIds_Null, "lastInput should not be JavaScript null");

        this->lastPattern = lastPattern;
        this->lastInput = lastInput;
        this->lastMatch = lastMatch;
        this->reset = true;
        this->invalidatedLastMatch = false;
    }